

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::PromReadByte25AA128(FpgaIO *this,uint16_t addr,uint8_t *data,uchar chan)

{
  BasePort *pBVar1;
  bool bVar2;
  uint in_EAX;
  int iVar3;
  nodeaddr_t nVar4;
  undefined7 in_register_00000009;
  PromType type;
  undefined6 in_register_00000032;
  uint32_t result;
  undefined8 uStack_28;
  
  iVar3 = (int)CONCAT71(in_register_00000009,chan);
  type = PROM_25AA128_1;
  if (iVar3 != 1) {
    type = (iVar3 == 2) + 2 + (uint)(iVar3 == 2);
  }
  uStack_28 = (ulong)in_EAX;
  nVar4 = GetPromAddress(this,type,true);
  pBVar1 = (this->super_BoardIO).port;
  iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar4,
                     (ulong)((int)CONCAT62(in_register_00000032,addr) * 0x100 + 0x3000000));
  if ((char)iVar3 == '\0') {
    uStack_28._4_1_ = '\0';
  }
  else {
    (*((this->super_BoardIO).port)->_vptr_BasePort[0x2c])();
    bVar2 = PromGetResult(this,(uint32_t *)((long)&uStack_28 + 4),type);
    if (!bVar2) {
      return false;
    }
  }
  *data = uStack_28._4_1_;
  return (bool)(char)iVar3;
}

Assistant:

bool FpgaIO::PromReadByte25AA128(uint16_t addr, uint8_t &data, unsigned char chan)
{
    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;

    // 8-bit cmd + 16-bit addr (2 MSBs ignored)
    uint32_t result = 0x00000000;
    quadlet_t write_data = 0x03000000|(addr << 8);
    nodeaddr_t address = GetPromAddress(prom_type, true);
    if (port->WriteQuadlet(BoardId, address, write_data)) {
        port->PromDelay();
        // Should be ready by now...
        if (!PromGetResult(result, prom_type))
            return false;
        // Get the last 8-bit of result
        data = result & 0xFF;
        return true;
    } else {
        data = 0x00;
        return false;
    }
}